

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O1

void DBaseDecal::SpreadLeft(double r,vertex_t *v1,side_t *feelwall,F3DFloor *ffloor)

{
  DVector2 *pDVar1;
  double dVar2;
  double dVar3;
  side_t *psVar4;
  DVector2 *pDVar5;
  long lVar6;
  ulong uVar7;
  line_t_conflict *plVar8;
  uint uVar9;
  side_t *feelwall_00;
  long lVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_70;
  
  TArray<side_t_*,_side_t_*>::Grow(&SpreadStack,1);
  SpreadStack.Array[SpreadStack.Count] = feelwall;
  SpreadStack.Count = SpreadStack.Count + 1;
  local_70 = r;
  if (r < 0.0) {
    do {
      uVar7 = (ulong)feelwall->LeftSide;
      if (uVar7 == 0xffffffff) {
        return;
      }
      feelwall = sides + uVar7;
      plVar8 = sides[uVar7].linedef;
      if (plVar8->sidedef[0] == feelwall) {
        dVar13 = (plVar8->delta).X;
        dVar14 = (plVar8->delta).Y;
      }
      else {
        pDVar1 = &plVar8->delta;
        pDVar5 = &plVar8->delta;
        plVar8 = (line_t_conflict *)&plVar8->v2;
        dVar13 = -pDVar1->X;
        dVar14 = -pDVar5->Y;
      }
      dVar2 = (v1->p).X;
      dVar3 = (v1->p).Y;
      v1 = plVar8->v1;
      dVar12 = c_sqrt(dVar14 * dVar14 + dVar13 * dVar13);
      (*(SpreadSource->super_DThinker).super_DObject._vptr_DObject[10])
                ((dVar13 * (DecalLeft + local_70)) / dVar12 + dVar2,
                 ((DecalLeft + local_70) * dVar14) / dVar12 + dVar3,SpreadZ,SpreadSource,
                 SpreadTemplate,feelwall,ffloor);
      TArray<side_t_*,_side_t_*>::Grow(&SpreadStack,1);
      SpreadStack.Array[SpreadStack.Count] = feelwall;
      SpreadStack.Count = SpreadStack.Count + 1;
      psVar4 = feelwall->linedef->sidedef[0];
      feelwall_00 = feelwall->linedef->sidedef[1];
      if (psVar4 == feelwall) {
        if (feelwall_00 == (side_t *)0x0) goto LAB_004b5988;
      }
      else {
        bVar11 = feelwall_00 != feelwall;
        feelwall_00 = psVar4;
        if (bVar11) {
LAB_004b5988:
          feelwall_00 = (side_t *)0x0;
        }
      }
      if ((feelwall_00 != (side_t *)0x0) && (feelwall_00->LeftSide != 0xffffffff)) {
        uVar9 = (int)SpreadStack.Count >> 0x1f & SpreadStack.Count;
        lVar10 = (long)(int)SpreadStack.Count;
        do {
          if (lVar10 < 1) goto LAB_004b59c1;
          lVar6 = lVar10 + -1;
          lVar10 = lVar10 + -1;
        } while (SpreadStack.Array[lVar6] != feelwall_00);
        uVar9 = 1;
LAB_004b59c1:
        if (uVar9 == 0) {
          SpreadLeft(local_70,*(vertex_t **)
                               (feelwall_00->linedef->args +
                               (ulong)(feelwall_00->linedef->sidedef[0] != feelwall_00) * 2 + -0xb),
                     feelwall_00,ffloor);
        }
      }
      local_70 = local_70 + dVar12;
    } while (local_70 < 0.0);
  }
  return;
}

Assistant:

void DBaseDecal::SpreadLeft (double r, vertex_t *v1, side_t *feelwall, F3DFloor *ffloor)
{
	double ldx, ldy;

	SpreadStack.Push (feelwall);

	while (r < 0 && feelwall->LeftSide != NO_SIDE)
	{
		double startr = r;

		double x = v1->fX();
		double y = v1->fY();

		feelwall = &sides[feelwall->LeftSide];
		GetWallStuff (feelwall, v1, ldx, ldy);
		double wallsize = Length (ldx, ldy);
		r += DecalLeft;
		x += r*ldx / wallsize;
		y += r*ldy / wallsize;
		r = wallsize + startr;
		SpreadSource->CloneSelf (SpreadTemplate, x, y, SpreadZ, feelwall, ffloor);
		SpreadStack.Push (feelwall);

		side_t *nextwall = NextWall (feelwall);
		if (nextwall != NULL && nextwall->LeftSide != NO_SIDE)
		{
			int i;

			for (i = SpreadStack.Size(); i-- > 0; )
			{
				if (SpreadStack[i] == nextwall)
					break;
			}
			if (i == -1)
			{
				vertex_t *v2;

				GetWallStuff (nextwall, v2, ldx, ldy);
				SpreadLeft (startr, v2, nextwall, ffloor);
			}
		}
	}
}